

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.h
# Opt level: O1

longdouble * __thiscall
TPZMatrix<long_double>::Get(TPZMatrix<long_double> *this,int64_t row,int64_t col)

{
  int iVar1;
  undefined4 extraout_var;
  
  iVar1 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])();
  return (longdouble *)CONCAT44(extraout_var,iVar1);
}

Assistant:

inline const TVar TPZMatrix<TVar>::Get(const int64_t row, const int64_t col ) const {
	// bound checking
#ifdef PZDEBUG
	if ( (row >= Rows()) || (col >= Cols()) || row <0 || col <0 ) {
		Error("TPZMatrix::Get", "Index out of range");
        DebugStop();
	}
#endif
	return( GetVal( row, col ) );
}